

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamWriterPrivate::EncodeQuerySequence
          (BamWriterPrivate *this,string *query,string *encodedQuery)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  BamException *this_00;
  byte *pbVar3;
  char *pcVar4;
  byte bVar5;
  byte *pbVar6;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::resize((ulong)encodedQuery,(char)(query->_M_string_length + 1 >> 1));
  pcVar4 = (query->_M_dataplus)._M_p;
  bVar2 = true;
  pbVar3 = (byte *)(encodedQuery->_M_dataplus)._M_p;
  do {
    switch(*pcVar4) {
    case '=':
      bVar5 = 0;
      break;
    case 'A':
      bVar5 = 1;
      break;
    case 'B':
      bVar5 = 0xe;
      break;
    case 'C':
      bVar5 = 2;
      break;
    case 'D':
      bVar5 = 0xd;
      break;
    case 'G':
      bVar5 = 4;
      break;
    case 'H':
      bVar5 = 0xb;
      break;
    case 'K':
      bVar5 = 0xc;
      break;
    case 'M':
      bVar5 = 3;
      break;
    case 'N':
      bVar5 = 0xf;
      break;
    case 'R':
      bVar5 = 5;
      break;
    case 'S':
      bVar5 = 6;
      break;
    case 'T':
      bVar5 = 8;
      break;
    case 'V':
      bVar5 = 7;
      break;
    case 'W':
      bVar5 = 9;
      break;
    case 'Y':
      bVar5 = 10;
      break;
    default:
      if (*pcVar4 == '\0') {
        return;
      }
    case '>':
    case '?':
    case '@':
    case 'E':
    case 'F':
    case 'I':
    case 'J':
    case 'L':
    case 'O':
    case 'P':
    case 'Q':
    case 'U':
    case 'X':
      paVar1 = &local_60.field_2;
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"invalid base: ","");
      std::operator+(&local_40,&local_60,*pcVar4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar1) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      this_00 = (BamException *)__cxa_allocate_exception(0x28);
      local_60._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"BamWriter::EncodeQuerySequence","");
      BamException::BamException(this_00,&local_60,&local_40);
      __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
    }
    if (bVar2) {
      bVar5 = bVar5 << 4;
      pbVar6 = pbVar3;
    }
    else {
      bVar5 = bVar5 | *pbVar3;
      pbVar6 = pbVar3 + 1;
    }
    *pbVar3 = bVar5;
    bVar2 = (bool)(bVar2 ^ 1);
    pcVar4 = pcVar4 + 1;
    pbVar3 = pbVar6;
  } while( true );
}

Assistant:

void BamWriterPrivate::EncodeQuerySequence(const std::string& query, std::string& encodedQuery)
{

    // prepare the encoded query string
    const std::size_t queryLength = query.size();
    const std::size_t encodedQueryLength = static_cast<std::size_t>((queryLength + 1) / 2);
    encodedQuery.resize(encodedQueryLength);
    char* pEncodedQuery = (char*)encodedQuery.data();
    const char* pQuery = (const char*)query.data();

    // walk through original query sequence, encoding its bases
    unsigned char nucleotideCode;
    bool useHighWord = true;
    while (*pQuery) {
        switch (*pQuery) {
            case (Constants::BAM_DNA_EQUAL):
                nucleotideCode = Constants::BAM_BASECODE_EQUAL;
                break;
            case (Constants::BAM_DNA_A):
                nucleotideCode = Constants::BAM_BASECODE_A;
                break;
            case (Constants::BAM_DNA_C):
                nucleotideCode = Constants::BAM_BASECODE_C;
                break;
            case (Constants::BAM_DNA_M):
                nucleotideCode = Constants::BAM_BASECODE_M;
                break;
            case (Constants::BAM_DNA_G):
                nucleotideCode = Constants::BAM_BASECODE_G;
                break;
            case (Constants::BAM_DNA_R):
                nucleotideCode = Constants::BAM_BASECODE_R;
                break;
            case (Constants::BAM_DNA_S):
                nucleotideCode = Constants::BAM_BASECODE_S;
                break;
            case (Constants::BAM_DNA_V):
                nucleotideCode = Constants::BAM_BASECODE_V;
                break;
            case (Constants::BAM_DNA_T):
                nucleotideCode = Constants::BAM_BASECODE_T;
                break;
            case (Constants::BAM_DNA_W):
                nucleotideCode = Constants::BAM_BASECODE_W;
                break;
            case (Constants::BAM_DNA_Y):
                nucleotideCode = Constants::BAM_BASECODE_Y;
                break;
            case (Constants::BAM_DNA_H):
                nucleotideCode = Constants::BAM_BASECODE_H;
                break;
            case (Constants::BAM_DNA_K):
                nucleotideCode = Constants::BAM_BASECODE_K;
                break;
            case (Constants::BAM_DNA_D):
                nucleotideCode = Constants::BAM_BASECODE_D;
                break;
            case (Constants::BAM_DNA_B):
                nucleotideCode = Constants::BAM_BASECODE_B;
                break;
            case (Constants::BAM_DNA_N):
                nucleotideCode = Constants::BAM_BASECODE_N;
                break;
            default:
                const std::string message = std::string("invalid base: ") + *pQuery;
                throw BamException("BamWriter::EncodeQuerySequence", message);
        }

        // pack the nucleotide code
        if (useHighWord) {
            *pEncodedQuery = nucleotideCode << 4;
            useHighWord = false;
        } else {
            *pEncodedQuery |= nucleotideCode;
            ++pEncodedQuery;
            useHighWord = true;
        }

        // increment the query position
        ++pQuery;
    }
}